

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6ValidSelfIssuedpathLenConstraintTest15<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section6ValidSelfIssuedpathLenConstraintTest15
          (Section6ValidSelfIssuedpathLenConstraintTest15<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6ValidSelfIssuedpathLenConstraintTest15) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "pathLenConstraint0CACert",
                               "pathLenConstraint0SelfIssuedCACert",
                               "ValidSelfIssuedpathLenConstraintTest15EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint0CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.15";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}